

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O1

void __thiscall
idx2::WriteChunkExponents
          (idx2 *this,idx2_file *Idx2,encode_data *E,sub_channel *Sc,i8 Level,i8 Subband)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  void *__src;
  u64 *puVar6;
  ulong *puVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  char Level_00;
  uint uVar10;
  byte bVar11;
  unsigned_long *puVar12;
  int iVar13;
  uint uVar14;
  bucket_status *pbVar15;
  byte *pbVar16;
  i64 NewCapacity;
  ulong uVar17;
  long lVar18;
  undefined8 in_XMM0_Qa;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM4_Qb;
  iterator CemIt;
  file_id FileId;
  chunk_exp_info ChunkExpInfo;
  iterator local_100;
  undefined1 local_e0 [24];
  chunk_exp_info local_c8;
  
  Level_00 = (char)Sc;
  pbVar15 = (E->Channels).Stats;
  *(i64 *)pbVar15 = (E->Channels).Size;
  uVar10 = (uint)(E->Channels).LogCapacity;
  if (0 < (int)uVar10 >> 3) {
    (E->Channels).Size = ((ulong)(E->Channels).Size >> 1) >> (((byte)uVar10 & 0xf8) - 1 & 0x3f);
  }
  pbVar15 = pbVar15 + ((int)uVar10 >> 3);
  (E->Channels).Stats = pbVar15;
  *(uint *)&(E->Channels).LogCapacity = uVar10 & 7;
  local_c8.ExpSizes.Stream.Data = (byte *)(E->BrickPool).Alloc;
  auVar19._0_8_ =
       (double)(long)(pbVar15 +
                     ((ulong)((uVar10 & 7) + 7 >> 3) - (long)local_c8.ExpSizes.Stream.Data));
  auVar19._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _ZN4idx2L25UncompressedExpChunksStatE_0;
  auVar9 = vminsd_avx(auVar19,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _ZN4idx2L25UncompressedExpChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar19,auVar2);
  _ZN4idx2L25UncompressedExpChunksStatE_2 = auVar19._0_8_ + _ZN4idx2L25UncompressedExpChunksStatE_2;
  _ZN4idx2L25UncompressedExpChunksStatE_0 = auVar9._0_8_;
  _ZN4idx2L25UncompressedExpChunksStatE_3 = _ZN4idx2L25UncompressedExpChunksStatE_3 + 1;
  _ZN4idx2L25UncompressedExpChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L25UncompressedExpChunksStatE_4 =
       auVar19._0_8_ * auVar19._0_8_ + _ZN4idx2L25UncompressedExpChunksStatE_4;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data =
       (byte *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  *(undefined4 *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc = 0;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Bytes = 0;
  iVar13 = (int)(E->Channels).LogCapacity;
  iVar4 = iVar13 + 7;
  iVar13 = iVar13 + 0xe;
  if (-1 < iVar4) {
    iVar13 = iVar4;
  }
  local_c8.ExpSizes.Stream.Alloc = (allocator *)(E->Channels).Vals;
  local_c8.ExpSizes.Stream.Bytes =
       (i64)((E->Channels).Stats + ((long)(iVar13 >> 3) - (long)local_c8.ExpSizes.Stream.Data));
  CompressBufZstd((buffer *)&local_c8,(bitstream *)&(Idx2->DecodeSubbandSpacings).Arr[9].Size);
  iVar13 = *(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc;
  iVar4 = iVar13 + 7;
  iVar13 = iVar13 + 0xe;
  if (-1 < iVar4) {
    iVar13 = iVar4;
  }
  auVar20._0_8_ =
       (double)(long)((Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data +
                     ((long)(iVar13 >> 3) - (Idx2->DecodeSubbandSpacings).Arr[9].Size));
  auVar20._8_8_ = in_XMM4_Qb;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_0;
  auVar1 = vminsd_avx(auVar20,auVar9);
  _ZN4idx2L23CompressedExpChunksStatE_0 = auVar1._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar20,auVar3);
  _ZN4idx2L23CompressedExpChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L23CompressedExpChunksStatE_2 = auVar20._0_8_ + _ZN4idx2L23CompressedExpChunksStatE_2;
  _ZN4idx2L23CompressedExpChunksStatE_3 = _ZN4idx2L23CompressedExpChunksStatE_3 + 1;
  _ZN4idx2L23CompressedExpChunksStatE_4 =
       auVar20._0_8_ * auVar20._0_8_ + _ZN4idx2L23CompressedExpChunksStatE_4;
  (E->Channels).Stats = (bucket_status *)(E->BrickPool).Alloc;
  *(undefined4 *)&(E->Channels).LogCapacity = 0;
  (E->Channels).Size = 0;
  puVar12 = (unsigned_long *)(ulong)(uint)(int)Level_00;
  ConstructFilePath((file_id *)local_e0,(idx2_file *)this,(u64)(E->SubChannels).Keys,Level_00,Level,
                    0);
  Lookup<unsigned_long,idx2::chunk_exp_info>
            (&local_100,(idx2 *)&(Idx2->DecodeSubbandSpacings).Arr[6].Size,
             (hash_table<unsigned_long,_idx2::chunk_exp_info> *)(local_e0 + 0x10),puVar12);
  if ((local_100.Ht)->Stats[local_100.Idx] != Occupied) {
    chunk_exp_info::chunk_exp_info(&local_c8);
    if (Mallocator()::Instance == '\0') {
      WriteChunkExponents();
    }
    (*(code *)*Mallocator()::Instance)(&Mallocator()::Instance,&local_c8,0x88);
    local_c8.ExpSizes.BitPtr = local_c8.ExpSizes.Stream.Data;
    local_c8.ExpSizes.BitPos = 0;
    local_c8.ExpSizes.BitBuf = 0;
    Insert<unsigned_long,idx2::chunk_exp_info>
              (&local_100,(unsigned_long *)(local_e0 + 0x10),&local_c8);
  }
  lVar5 = ((local_100.Val)->ExpSizes).Stream.Bytes;
  iVar13 = ((local_100.Val)->ExpSizes).BitPos;
  iVar4 = iVar13 + 7;
  iVar13 = iVar13 + 0xe;
  if (-1 < iVar4) {
    iVar13 = iVar4;
  }
  for (lVar18 = lVar5;
      lVar18 <= (long)(((local_100.Val)->ExpSizes).BitPtr +
                      ((long)(iVar13 >> 3) - (long)((local_100.Val)->ExpSizes).Stream.Data) + 0xc);
      lVar18 = (lVar18 * 3) / 2 + 8) {
  }
  if ((lVar5 < lVar18) && (lVar5 < lVar18 + 8)) {
    if (Mallocator()::Instance == '\0') {
      WriteChunkExponents();
    }
    local_c8.ExpSizes.Stream.Data = (byte *)0x0;
    local_c8.ExpSizes.Stream.Bytes = 0;
    local_c8.ExpSizes.Stream.Alloc = (allocator *)&Mallocator()::Instance;
    AllocBuf((buffer *)&local_c8,lVar18 + 8,((local_100.Val)->ExpSizes).Stream.Alloc);
    iVar13 = ((local_100.Val)->ExpSizes).BitPos;
    iVar4 = iVar13 + 7;
    iVar13 = iVar13 + 0xe;
    if (-1 < iVar4) {
      iVar13 = iVar4;
    }
    MemCopy((buffer *)local_100.Val,(buffer *)&local_c8,
            (u64)(((local_100.Val)->ExpSizes).BitPtr +
                 ((long)(iVar13 >> 3) - (long)((local_100.Val)->ExpSizes).Stream.Data)));
    ((local_100.Val)->ExpSizes).BitPtr =
         (byte *)(((long)((local_100.Val)->ExpSizes).BitPtr -
                  (long)((local_100.Val)->ExpSizes).Stream.Data) +
                 (long)local_c8.ExpSizes.Stream.Data);
    DeallocBuf((buffer *)local_100.Val);
    ((local_100.Val)->ExpSizes).Stream.Alloc = local_c8.ExpSizes.Stream.Alloc;
    ((local_100.Val)->ExpSizes).Stream.Data = local_c8.ExpSizes.Stream.Data;
    ((local_100.Val)->ExpSizes).Stream.Bytes = local_c8.ExpSizes.Stream.Bytes;
  }
  __src = (void *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  iVar13 = *(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc;
  iVar4 = iVar13 + 7;
  iVar13 = iVar13 + 0xe;
  if (-1 < iVar4) {
    iVar13 = iVar4;
  }
  uVar10 = ((local_100.Val)->ExpSizes).BitPos;
  pbVar16 = (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data + ((long)(iVar13 >> 3) - (long)__src);
  do {
    if (0x38 < (int)uVar10) {
      puVar6 = (u64 *)((local_100.Val)->ExpSizes).BitPtr;
      *puVar6 = ((local_100.Val)->ExpSizes).BitBuf;
      ((local_100.Val)->ExpSizes).BitBuf =
           (((local_100.Val)->ExpSizes).BitBuf >> 1) >> (((byte)uVar10 & 0xf8) - 1 & 0x3f);
      ((local_100.Val)->ExpSizes).BitPtr = (byte *)((ulong)(uVar10 >> 3) + (long)puVar6);
      uVar10 = uVar10 & 7;
    }
    uVar17 = (ulong)((uint)pbVar16 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar10 & 0x3f)
             | ((local_100.Val)->ExpSizes).BitBuf;
    ((local_100.Val)->ExpSizes).BitBuf = uVar17;
    uVar14 = uVar10 + 7;
    if (0x37 < (int)uVar10) {
      puVar7 = (ulong *)((local_100.Val)->ExpSizes).BitPtr;
      *puVar7 = uVar17;
      if (7 < uVar14) {
        ((local_100.Val)->ExpSizes).BitBuf =
             (((local_100.Val)->ExpSizes).BitBuf >> 1) >> (((byte)uVar14 & 0xf8) - 1 & 0x3f);
      }
      ((local_100.Val)->ExpSizes).BitPtr = (byte *)((long)puVar7 + (ulong)(uVar14 >> 3));
      uVar14 = uVar14 & 7;
    }
    puVar6 = &((local_100.Val)->ExpSizes).BitBuf;
    *puVar6 = *puVar6 | (ulong)((byte *)0x7f < pbVar16 & (uint)bitstream::Masks.Arr[1]) <<
                        ((byte)uVar14 & 0x3f);
    uVar10 = uVar14 + 1;
    bVar8 = (byte *)0x7f < pbVar16;
    pbVar16 = (byte *)((ulong)pbVar16 >> 7);
  } while (bVar8);
  ((local_100.Val)->ExpSizes).BitPos = uVar10;
  iVar13 = *(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc;
  iVar4 = iVar13 + 7;
  iVar13 = iVar13 + 0xe;
  if (-1 < iVar4) {
    iVar13 = iVar4;
  }
  pbVar16 = (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data + ((long)(iVar13 >> 3) - (long)__src);
  lVar5 = ((local_100.Val)->FileExpBuffer).Size;
  for (NewCapacity = ((local_100.Val)->FileExpBuffer).Capacity;
      NewCapacity <= (long)(pbVar16 + lVar5); NewCapacity = (NewCapacity * 3) / 2 + 8) {
  }
  GrowCapacity<unsigned_char>(&(local_100.Val)->FileExpBuffer,NewCapacity);
  if (lVar5 < ((local_100.Val)->FileExpBuffer).Buffer.Bytes) {
    memcpy(((local_100.Val)->FileExpBuffer).Buffer.Data + lVar5,__src,(size_t)pbVar16);
    ((local_100.Val)->FileExpBuffer).Size = (i64)(pbVar16 + lVar5);
    if (Level_00 < '\x10') {
      puVar12 = (E->SubChannels).Keys;
      iVar4 = *(int *)(this + (long)Level_00 * 4 + 0xa00);
      uVar17 = (ulong)iVar4;
      if (((local_100.Val)->Addrs).Capacity <= ((local_100.Val)->Addrs).Size) {
        GrowCapacity<unsigned_long>(&(local_100.Val)->Addrs,0);
      }
      lVar5 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      bVar11 = -(iVar4 == 0) | (byte)lVar5;
      pbVar16 = ((local_100.Val)->Addrs).Buffer.Data;
      lVar5 = ((local_100.Val)->Addrs).Size;
      ((local_100.Val)->Addrs).Size = lVar5 + 1;
      *(ulong *)(pbVar16 + lVar5 * 8) =
           (long)((int)Level << 0xc) + ((ulong)((uint)Sc & 0xff) << 0x3c) +
           ((ulong)puVar12 >> ((1L << (bVar11 & 0x3f) != uVar17) + bVar11 & 0x3f)) * 0x40000;
      (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data =
           (byte *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
      *(undefined4 *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc = 0;
      (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Bytes = 0;
      return;
    }
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  __assert_fail("Idx < Bytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.h"
                ,0x165,"byte &idx2::buffer::operator[](i64) const");
}

Assistant:

void
WriteChunkExponents(const idx2_file& Idx2, encode_data* E, sub_channel* Sc, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_write){

    /* brick exponents */
    Flush(&Sc->BrickExpStream);
    UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
    Rewind(&E->ChunkExpStream);
    CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
    CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));
    Rewind(&Sc->BrickExpStream);
    u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
    buffer Buf = ToBuffer(E->ChunkExpStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkExpAddress))
      idx2_ExitIf(true, "Write chunk exponent failed\n");
    Rewind(&E->ChunkExpStream);
    return;
  }
#endif

  /* brick exponents */
  Flush(&Sc->BrickExpStream);
  UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
  Rewind(&E->ChunkExpStream);
  CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
  CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));

  /* rewind */
  Rewind(&Sc->BrickExpStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  /* keep track of the chunk sizes */
  auto CemIt = Lookup(E->ChunkExponents, FileId.Id);
  if (!CemIt)
  {
    chunk_exp_info ChunkExpInfo;
    InitWrite(&ChunkExpInfo.ExpSizes, 128);
    //Init(&ChunkEMaxInfo.FileEMaxBuffer, 128);
    Insert(&CemIt, FileId.Id, ChunkExpInfo);
  }
  chunk_exp_info* Ce = CemIt.Val;
  bitstream* ChunkEMaxSzs = &Ce->ExpSizes;
  GrowToAccomodate(ChunkEMaxSzs, 4);
  // write the size of the exponent stream for current chunk
  WriteVarByte(ChunkEMaxSzs, Size(E->ChunkExpStream));
  array<u8>* ExpBuffer = &Ce->FileExpBuffer;
  // write the exponents to the exponent buffer for the whole file
  PushBack(ExpBuffer, E->ChunkExpStream.Stream.Data, Size(E->ChunkExpStream));
  //printf("%lld %lld\n", Size(E->ChunkExpStream), Size(*EMaxBuffer));
  u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  PushBack(&Ce->Addrs, ChunkExpAddress);
  Rewind(&E->ChunkExpStream);
}